

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void __thiscall
divsufsortxx::core::constructSA_from_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long m,
          int alphabetsize)

{
  core cVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pos_type pVar5;
  BitmapArray<long> *pBVar6;
  BitmapArray<long> *pBVar7;
  BitmapArray<long> *extraout_RDX;
  long lVar8;
  BitmapArray<long> *extraout_RDX_00;
  BitmapArray<long> *extraout_RDX_01;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint local_8c;
  BitmapArray<long> *local_80;
  
  pVar5 = SA.pos_;
  pBVar6 = SA.array_;
  if (0 < n) {
    local_80 = pBVar6;
    for (lVar10 = (long)((int)m + -2); -1 < lVar10; lVar10 = lVar10 + -1) {
      lVar2 = lVar10 * (int)m;
      lVar9 = bucket_A[lVar2 + lVar10 + 1];
      pBVar7 = pBVar6;
      uVar11 = (long)&(pBVar6->super_Bitmap)._vptr_Bitmap + *(long *)(pVar5 + 8 + lVar10 * 8) + 1;
      local_8c = 0xffffffff;
      while (uVar4 = uVar11, (ulong)((long)&(pBVar6->super_Bitmap)._vptr_Bitmap + lVar9) < uVar4) {
        uVar11 = uVar4 - 1;
        uVar3 = (**(code **)(*(long *)T + 0x28))(T,uVar11,pBVar7);
        pBVar7 = (BitmapArray<long> *)~uVar3;
        if ((long)uVar3 < 0) {
          (**(code **)(*(long *)T + 0x20))(T,uVar11);
          pBVar7 = extraout_RDX;
        }
        else if (uVar3 != 0) {
          cVar1 = this[uVar3 - 1];
          if ((char)cVar1 <= lVar10) {
            (**(code **)(*(long *)T + 0x20))(T,uVar4 - 1);
            if (uVar3 == 1) {
              lVar8 = 0;
            }
            else {
              lVar8 = -uVar3;
              if ((char)this[uVar3 - 2] <= (char)cVar1) {
                lVar8 = uVar3 - 1;
              }
            }
            if (local_8c == (int)(char)cVar1) {
              local_80 = (BitmapArray<long> *)&local_80[-1].field_0x27;
              (**(code **)(*(long *)T + 0x20))(T);
              pBVar7 = extraout_RDX_00;
              uVar11 = uVar4 - 1;
            }
            else {
              if (-1 < (int)local_8c) {
                bucket_A[lVar2 + (ulong)local_8c] = (long)local_80 - (long)pBVar6;
              }
              local_80 = (BitmapArray<long> *)((long)pBVar6 + bucket_A[lVar2 + (char)cVar1] + -1);
              (**(code **)(*(long *)T + 0x20))(T,local_80,lVar8);
              pBVar7 = extraout_RDX_01;
              uVar11 = uVar4 - 1;
              local_8c = (int)(char)cVar1;
            }
          }
        }
      }
    }
  }
  uVar11 = (ulong)(char)(this + -1)[(long)bucket_B];
  lVar10 = (long)&(pBVar6->super_Bitmap)._vptr_Bitmap + *(long *)(pVar5 + uVar11 * 8) + 1;
  (**(code **)(*(long *)T + 0x20))(T,lVar10,(long)bucket_B + -1);
  for (pBVar7 = pBVar6; pBVar7 < (BitmapArray<long> *)((long)bucket_B + (long)pBVar6);
      pBVar7 = (BitmapArray<long> *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + 1)) {
    uVar4 = (**(code **)(*(long *)T + 0x28))(T,pBVar7);
    if ((long)uVar4 < 0) {
      (**(code **)(*(long *)T + 0x20))(T,pBVar7,~uVar4);
    }
    else if (uVar4 != 0) {
      cVar1 = this[uVar4 - 1];
      uVar12 = (uint)(char)cVar1;
      if ((char)this[uVar4] <= (char)cVar1) {
        if (uVar4 == 1) {
          lVar9 = 0;
        }
        else {
          lVar9 = uVar4 - 1;
          if ((char)this[uVar4 - 2] < (char)cVar1) {
            lVar9 = -uVar4;
          }
        }
        if ((uint)uVar11 == uVar12) {
          lVar10 = lVar10 + 1;
          (**(code **)(*(long *)T + 0x20))(T,lVar10);
        }
        else {
          *(long *)(pVar5 + (long)(int)(uint)uVar11 * 8) = lVar10 - (long)pBVar6;
          lVar10 = (long)&(pBVar6->super_Bitmap)._vptr_Bitmap +
                   *(long *)(pVar5 + (long)(int)uVar12 * 8) + 1;
          (**(code **)(*(long *)T + 0x20))(T,lVar10,lVar9);
          uVar11 = (ulong)uVar12;
        }
      }
    }
  }
  return;
}

Assistant:

void constructSA_from_typeBstar(const StringIterator_type T, SAIterator_type SA,
                                pos_type *bucket_A, pos_type *bucket_B,
                                pos_type n, pos_type m,
                                alphabetsize_type alphabetsize) {
  SAIterator_type i, j, t = SA;
  pos_type s;
  alphabetsize_type c0, c1, c2;

  /** An implementation version of MSufSort3's second stage. **/

  if (0 < m) {
    /* Construct the sorted order of type B suffixes by using
     the sorted order of type B* suffixes. */
    for (c1 = alphabetsize - 2; 0 <= c1; --c1) {
      /* Scan the suffix array from right to left. */
      for (i = SA + BUCKET_BSTAR(c1, c1 + 1), j = SA + (BUCKET_A(c1 + 1)+ 1),
      c2 = -1;
      i < j;) {
        if(0 <= (s = *--j)) {
          if((0 <= --s) && ((c0 = T[s]) <= c1)) {
            *j = ~(s + 1);
            if((0 < s) && (T[s - 1] > c0)) {s = ~s;}
            if(c2 == c0) {*--t = s;}
            else {
              if(0 <= c2) {BUCKET_B(c2, c1) = t - SA;}
              *(t = SA + BUCKET_B(c2 = c0, c1) - 1) = s;
            }
          }
        } else {
          *j = ~s;
        }
      }
    }
  }

  /* Construct the suffix array by using
   the sorted order of type B suffixes. */
  *(t = SA + (BUCKET_A(c2 = T[n - 1])+ 1)) = n - 1;
  /* Scan the suffix array from left to right. */
  for (i = SA, j = SA + n; i < j; ++i) {
    if (0 <= (s = *i)) {
      if ((0 <= --s) && ((c0 = T[s]) >= T[s + 1])) {
        if ((0 < s) && (T[s - 1] < c0)) {
          s = ~s;
        }
        if (c0 == c2) {
          *++t = s;
        } else {
          BUCKET_A(c2)= t - SA;
          *(t = SA + (BUCKET_A(c2 = c0) + 1)) = s;
        }
      }
    } else {
      *i = ~s;
    }
  }
}